

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::NewCovergroupExpression::serializeTo
          (NewCovergroupExpression *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  ppEVar1 = (this->arguments)._M_ptr;
  sVar2 = (this->arguments)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void NewCovergroupExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();
}